

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void display_word(char *word,char *attempted_letters)

{
  char *pcVar1;
  long local_20;
  size_t n;
  char *attempted_letters_local;
  char *word_local;
  
  for (local_20 = 0; word[local_20] != '\0'; local_20 = local_20 + 1) {
    pcVar1 = strchr(attempted_letters,(int)word[local_20]);
    if (pcVar1 == (char *)0x0) {
      printf("-");
    }
    else {
      printf("%c",(ulong)(uint)(int)word[local_20]);
    }
  }
  printf("\n");
  return;
}

Assistant:

void display_word(const char* word, char attempted_letters[27]) {
  for (size_t n = 0; word[n]; n++) {
    if (strchr(attempted_letters, word[n]) != NULL) {
      printf("%c", word[n]);
    } else {
      printf("-");
    }
  }
  printf("\n");
}